

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O2

int av1_txfm_search(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,RD_STATS *rd_stats,
                   RD_STATS *rd_stats_y,RD_STATS *rd_stats_uv,int mode_rate,int64_t ref_best_rd)

{
  byte bVar1;
  byte bVar2;
  uint8_t uVar3;
  int iVar4;
  int iVar5;
  MB_MODE_INFO *pMVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int64_t ref_best_rd_00;
  undefined4 uVar12;
  undefined1 auVar13 [16];
  
  uVar7 = av1_get_skip_txfm_context(&x->e_mbd);
  iVar4 = (x->mode_costs).skip_txfm_cost[uVar7][0];
  iVar5 = (x->mode_costs).skip_txfm_cost[uVar7][1];
  iVar11 = iVar5;
  if (iVar4 < iVar5) {
    iVar11 = iVar4;
  }
  if (ref_best_rd < (long)(iVar11 + mode_rate) * (long)x->rdmult + 0x100 >> 9) {
    rd_stats_y->rate = 0x7fffffff;
    rd_stats_y->zero_rate = 0;
    rd_stats_y->dist = 0x7fffffffffffffff;
    rd_stats_y->rdcost = 0x7fffffffffffffff;
    rd_stats_y->sse = 0x7fffffffffffffff;
    rd_stats_y->skip_txfm = '\0';
    return 0;
  }
  pMVar6 = *(x->e_mbd).mi;
  ref_best_rd_00 = ref_best_rd - ((long)x->rdmult * (long)mode_rate + 0x100 >> 9);
  if (ref_best_rd == 0x7fffffffffffffff) {
    ref_best_rd_00 = 0x7fffffffffffffff;
  }
  rd_stats->dist = 0;
  rd_stats->rdcost = 0;
  rd_stats->sse = 0;
  rd_stats->skip_txfm = '\x01';
  rd_stats->zero_rate = 0;
  rd_stats_y->rate = 0;
  rd_stats_y->zero_rate = 0;
  rd_stats_y->sse = 0;
  rd_stats_y->dist = 0;
  rd_stats_y->rdcost = 0;
  rd_stats_y->skip_txfm = '\x01';
  rd_stats->rate = mode_rate;
  av1_subtract_plane(x,bsize,0);
  if (((x->txfm_search_params).tx_mode_search_type == '\x02') &&
     ((x->e_mbd).lossless[*(ushort *)&pMVar6->field_0xa7 & 7] == 0)) {
    av1_pick_recursive_tx_size_type_yrd(cpi,x,rd_stats_y,bsize,ref_best_rd_00);
  }
  else {
    av1_pick_uniform_tx_size_type_yrd(cpi,x,rd_stats_y,bsize,ref_best_rd_00);
    auVar13 = ZEXT216(CONCAT11(pMVar6->tx_size,pMVar6->tx_size));
    auVar13 = pshuflw(auVar13,auVar13,0);
    uVar12 = auVar13._0_4_;
    *(undefined4 *)pMVar6->inter_tx_size = uVar12;
    *(undefined4 *)(pMVar6->inter_tx_size + 4) = uVar12;
    *(undefined4 *)(pMVar6->inter_tx_size + 8) = uVar12;
    *(undefined4 *)(pMVar6->inter_tx_size + 0xc) = uVar12;
    bVar1 = (x->e_mbd).height;
    bVar2 = (x->e_mbd).width;
    for (lVar9 = 0; (ulong)bVar2 * (ulong)bVar1 - lVar9 != 0; lVar9 = lVar9 + 1) {
      (x->txfm_search_info).blk_skip[lVar9] =
           (x->txfm_search_info).blk_skip[lVar9] & 0xfe | rd_stats_y->skip_txfm != '\0';
    }
  }
  if (rd_stats_y->rate == 0x7fffffff) {
    return 0;
  }
  av1_merge_rd_stats(rd_stats,rd_stats_y);
  lVar10 = rd_stats->dist * 0x80 +
           (((long)rd_stats->rate + (long)iVar4) * (long)x->rdmult + 0x100 >> 9);
  iVar11 = mode_rate + iVar5;
  lVar9 = rd_stats->sse * 0x80 + ((long)x->rdmult * (long)iVar11 + 0x100 >> 9);
  if (lVar10 < lVar9) {
    lVar9 = lVar10;
  }
  if (ref_best_rd < lVar9) {
    return 0;
  }
  rd_stats_uv->rate = 0;
  rd_stats_uv->zero_rate = 0;
  rd_stats_uv->dist = 0;
  rd_stats_uv->rdcost = 0;
  rd_stats_uv->sse = 0;
  rd_stats_uv->skip_txfm = '\x01';
  if (((cpi->common).seq_params)->monochrome == '\0') {
    if ((cpi->sf).inter_sf.perform_best_rd_based_gating_for_chroma == 0) {
      lVar9 = 0;
    }
    if (ref_best_rd == 0x7fffffffffffffff) {
      lVar9 = 0;
    }
    iVar8 = av1_txfm_uvrd(cpi,x,rd_stats_uv,bsize,ref_best_rd - lVar9);
    if (iVar8 == 0) {
      return 0;
    }
    av1_merge_rd_stats(rd_stats,rd_stats_uv);
  }
  uVar3 = rd_stats->skip_txfm;
  if (uVar3 == '\0') {
    if (((x->e_mbd).lossless[*(ushort *)&pMVar6->field_0xa7 & 7] != 0) ||
       (lVar9 = rd_stats->sse,
       rd_stats->dist * 0x80 +
       ((long)(rd_stats_y->rate + iVar4 + rd_stats_uv->rate) * (long)x->rdmult + 0x100 >> 9) <
       lVar9 * 0x80 + ((long)iVar5 * (long)x->rdmult + 0x100 >> 9))) {
      rd_stats->rate = rd_stats->rate + iVar4;
      pMVar6->skip_txfm = '\0';
      return 1;
    }
  }
  else {
    lVar9 = rd_stats->sse;
  }
  rd_stats_y->rate = 0;
  rd_stats_uv->rate = 0;
  rd_stats->rate = iVar11;
  rd_stats->dist = lVar9;
  rd_stats_y->dist = rd_stats_y->sse;
  rd_stats_uv->dist = rd_stats_uv->sse;
  pMVar6->skip_txfm = '\x01';
  if ((uVar3 != '\0') &&
     (ref_best_rd < rd_stats->dist * 0x80 + ((long)x->rdmult * (long)iVar11 + 0x100 >> 9))) {
    return 0;
  }
  return 1;
}

Assistant:

int av1_txfm_search(const AV1_COMP *cpi, MACROBLOCK *x, BLOCK_SIZE bsize,
                    RD_STATS *rd_stats, RD_STATS *rd_stats_y,
                    RD_STATS *rd_stats_uv, int mode_rate, int64_t ref_best_rd) {
  MACROBLOCKD *const xd = &x->e_mbd;
  TxfmSearchParams *txfm_params = &x->txfm_search_params;
  const int skip_ctx = av1_get_skip_txfm_context(xd);
  const int skip_txfm_cost[2] = { x->mode_costs.skip_txfm_cost[skip_ctx][0],
                                  x->mode_costs.skip_txfm_cost[skip_ctx][1] };
  const int64_t min_header_rate =
      mode_rate + AOMMIN(skip_txfm_cost[0], skip_txfm_cost[1]);
  // Account for minimum skip and non_skip rd.
  // Eventually either one of them will be added to mode_rate
  const int64_t min_header_rd_possible = RDCOST(x->rdmult, min_header_rate, 0);
  if (min_header_rd_possible > ref_best_rd) {
    av1_invalid_rd_stats(rd_stats_y);
    return 0;
  }

  const AV1_COMMON *cm = &cpi->common;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int64_t mode_rd = RDCOST(x->rdmult, mode_rate, 0);
  const int64_t rd_thresh =
      ref_best_rd == INT64_MAX ? INT64_MAX : ref_best_rd - mode_rd;
  av1_init_rd_stats(rd_stats);
  av1_init_rd_stats(rd_stats_y);
  rd_stats->rate = mode_rate;

  // cost and distortion
  av1_subtract_plane(x, bsize, 0);
  if (txfm_params->tx_mode_search_type == TX_MODE_SELECT &&
      !xd->lossless[mbmi->segment_id]) {
    av1_pick_recursive_tx_size_type_yrd(cpi, x, rd_stats_y, bsize, rd_thresh);
#if CONFIG_COLLECT_RD_STATS == 2
    PrintPredictionUnitStats(cpi, tile_data, x, rd_stats_y, bsize);
#endif  // CONFIG_COLLECT_RD_STATS == 2
  } else {
    av1_pick_uniform_tx_size_type_yrd(cpi, x, rd_stats_y, bsize, rd_thresh);
    memset(mbmi->inter_tx_size, mbmi->tx_size, sizeof(mbmi->inter_tx_size));
    for (int i = 0; i < xd->height * xd->width; ++i)
      set_blk_skip(x->txfm_search_info.blk_skip, 0, i, rd_stats_y->skip_txfm);
  }

  if (rd_stats_y->rate == INT_MAX) return 0;

  av1_merge_rd_stats(rd_stats, rd_stats_y);

  const int64_t non_skip_txfm_rdcosty =
      RDCOST(x->rdmult, rd_stats->rate + skip_txfm_cost[0], rd_stats->dist);
  const int64_t skip_txfm_rdcosty =
      RDCOST(x->rdmult, mode_rate + skip_txfm_cost[1], rd_stats->sse);
  const int64_t min_rdcosty = AOMMIN(non_skip_txfm_rdcosty, skip_txfm_rdcosty);
  if (min_rdcosty > ref_best_rd) return 0;

  av1_init_rd_stats(rd_stats_uv);
  const int num_planes = av1_num_planes(cm);
  if (num_planes > 1) {
    int64_t ref_best_chroma_rd = ref_best_rd;
    // Calculate best rd cost possible for chroma
    if (cpi->sf.inter_sf.perform_best_rd_based_gating_for_chroma &&
        (ref_best_chroma_rd != INT64_MAX)) {
      ref_best_chroma_rd = (ref_best_chroma_rd -
                            AOMMIN(non_skip_txfm_rdcosty, skip_txfm_rdcosty));
    }
    const int is_cost_valid_uv =
        av1_txfm_uvrd(cpi, x, rd_stats_uv, bsize, ref_best_chroma_rd);
    if (!is_cost_valid_uv) return 0;
    av1_merge_rd_stats(rd_stats, rd_stats_uv);
  }

  int choose_skip_txfm = rd_stats->skip_txfm;
  if (!choose_skip_txfm && !xd->lossless[mbmi->segment_id]) {
    const int64_t rdcost_no_skip_txfm = RDCOST(
        x->rdmult, rd_stats_y->rate + rd_stats_uv->rate + skip_txfm_cost[0],
        rd_stats->dist);
    const int64_t rdcost_skip_txfm =
        RDCOST(x->rdmult, skip_txfm_cost[1], rd_stats->sse);
    if (rdcost_no_skip_txfm >= rdcost_skip_txfm) choose_skip_txfm = 1;
  }
  if (choose_skip_txfm) {
    rd_stats_y->rate = 0;
    rd_stats_uv->rate = 0;
    rd_stats->rate = mode_rate + skip_txfm_cost[1];
    rd_stats->dist = rd_stats->sse;
    rd_stats_y->dist = rd_stats_y->sse;
    rd_stats_uv->dist = rd_stats_uv->sse;
    mbmi->skip_txfm = 1;
    if (rd_stats->skip_txfm) {
      const int64_t tmprd = RDCOST(x->rdmult, rd_stats->rate, rd_stats->dist);
      if (tmprd > ref_best_rd) return 0;
    }
  } else {
    rd_stats->rate += skip_txfm_cost[0];
    mbmi->skip_txfm = 0;
  }

  return 1;
}